

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::FindEntry
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pSection,char **a_pKey,char **a_pVal,char **a_pComment)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  ulong uVar6;
  byte *pbVar7;
  long lVar8;
  
  *a_pComment = (char *)0x0;
  pbVar3 = (byte *)*a_pData;
  bVar5 = *pbVar3;
  uVar6 = (ulong)bVar5;
  do {
    if (bVar5 == 0) {
      return false;
    }
    while ((byte)uVar6 < 0x3c) {
      if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
        if ((0x800000800000000U >> (uVar6 & 0x3f) & 1) != 0) {
          LoadMultiLineText(this,a_pData,a_pComment,(char *)0x0,true);
          pbVar3 = (byte *)*a_pData;
          uVar6 = (ulong)*pbVar3;
          goto LAB_0018608a;
        }
        if (uVar6 == 0) {
          return false;
        }
        break;
      }
      *a_pData = (char *)(pbVar3 + 1);
      uVar6 = (ulong)pbVar3[1];
      pbVar3 = pbVar3 + 1;
    }
    if ((int)uVar6 != 0x5b) {
      *a_pKey = (char *)pbVar3;
      pbVar3 = (byte *)*a_pData;
      pbVar7 = pbVar3;
LAB_001860e3:
      pbVar7 = pbVar7 + 1;
      bVar5 = *pbVar3;
      uVar6 = (ulong)bVar5;
      if (bVar5 < 0xd) {
        if ((bVar5 != 0) && (bVar5 != 10)) break;
      }
      else if (bVar5 != 0xd) {
        if (bVar5 != 0x3d) break;
        pbVar1 = (byte *)*a_pKey;
        if (pbVar3 == pbVar1) {
          uVar6 = 0x3d;
          while ((0xd < (byte)uVar6 || ((0x2401U >> ((uint)uVar6 & 0x1f) & 1) == 0))) {
            *a_pData = (char *)pbVar7;
            uVar6 = (ulong)*pbVar7;
            pbVar7 = pbVar7 + 1;
          }
          pbVar3 = pbVar7 + -1;
          goto LAB_0018608a;
        }
        pbVar7 = pbVar3 + -1;
        if (pbVar1 <= pbVar7) goto LAB_001861bb;
        goto LAB_001861d8;
      }
      goto LAB_0018608a;
    }
    do {
      pbVar3 = pbVar3 + 1;
      *a_pData = (char *)pbVar3;
      if (0x20 < (ulong)*pbVar3) break;
    } while ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0);
    *a_pSection = (char *)pbVar3;
    pbVar3 = (byte *)*a_pData;
    while( true ) {
      bVar5 = *pbVar3;
      uVar6 = (ulong)bVar5;
      if ((bVar5 < 0xe) && ((0x2401U >> (bVar5 & 0x1f) & 1) != 0)) break;
      if (bVar5 == 0x5d) {
        pbVar7 = pbVar3 + -1;
        if (*a_pSection <= pbVar7) goto LAB_00186155;
        goto LAB_00186172;
      }
      pbVar3 = pbVar3 + 1;
      *a_pData = (char *)pbVar3;
    }
LAB_0018608a:
    bVar5 = (byte)uVar6;
  } while( true );
  pbVar3 = pbVar3 + 1;
  *a_pData = (char *)pbVar3;
  goto LAB_001860e3;
  while (pbVar7 = pbVar7 + -1, pbVar1 <= pbVar7) {
LAB_001861bb:
    if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
  }
  pbVar3 = pbVar7 + 1;
LAB_001861d8:
  *pbVar3 = 0;
  pcVar4 = *a_pData;
  do {
    do {
      pcVar4 = pcVar4 + 1;
      *a_pData = pcVar4;
    } while (*pcVar4 == ' ');
  } while (*pcVar4 == '\t');
  *a_pVal = pcVar4;
  pbVar3 = (byte *)*a_pData;
  while (bVar5 = *pbVar3, bVar5 != 0) {
    if (bVar5 == 10) {
      lVar8 = 1;
LAB_00186223:
      *a_pData = (char *)(pbVar3 + lVar8);
      break;
    }
    if (bVar5 == 0xd) {
      lVar8 = (ulong)(pbVar3[1] == 10) + 1;
      goto LAB_00186223;
    }
    pbVar3 = pbVar3 + 1;
    *a_pData = (char *)pbVar3;
  }
  pbVar7 = pbVar3 + -1;
  if (*a_pVal <= pbVar7) {
    do {
      if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
      pbVar7 = pbVar7 + -1;
    } while (*a_pVal <= pbVar7);
    pbVar3 = pbVar7 + 1;
  }
  *pbVar3 = 0;
  if (this->m_bAllowMultiLine != true) {
    return true;
  }
  pcVar4 = *a_pVal;
  if (*pcVar4 != '<') {
    return true;
  }
  if (pcVar4[1] != '<') {
    return true;
  }
  if (pcVar4[2] == '<') {
    bVar2 = LoadMultiLineText(this,a_pData,a_pVal,pcVar4 + 3,false);
    return bVar2;
  }
  return true;
  while (pbVar7 = pbVar7 + -1, *a_pSection <= pbVar7) {
LAB_00186155:
    if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
  }
  pbVar3 = pbVar7 + 1;
LAB_00186172:
  *pbVar3 = 0;
  pbVar3 = (byte *)(*a_pData + 1);
  do {
    do {
      *a_pData = (char *)pbVar3;
      bVar5 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (0xd < bVar5);
  } while ((0x2401U >> (bVar5 & 0x1f) & 1) == 0);
  *a_pKey = (char *)0x0;
  *a_pVal = (char *)0x0;
  return true;
}

Assistant:

bool CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::FindEntry(SI_CHAR *&a_pData, const SI_CHAR *&a_pSection,
																   const SI_CHAR *&a_pKey, const SI_CHAR *&a_pVal,
																   const SI_CHAR *&a_pComment) const {
	a_pComment = NULL;

	SI_CHAR *pTrail = NULL;
	while (*a_pData) {
		// skip spaces and empty lines
		while (*a_pData && IsSpace(*a_pData)) {
			++a_pData;
		}
		if (!*a_pData) {
			break;
		}

		// skip processing of comment lines but keep a pointer to
		// the start of the comment.
		if (IsComment(*a_pData)) {
			LoadMultiLineText(a_pData, a_pComment, NULL, true);
			continue;
		}

		// process section names
		if (*a_pData == '[') {
			// skip leading spaces
			++a_pData;
			while (*a_pData && IsSpace(*a_pData)) {
				++a_pData;
			}

			// find the end of the section name (it may contain spaces)
			// and convert it to lowercase as necessary
			a_pSection = a_pData;
			while (*a_pData && *a_pData != ']' && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}

			// if it's an invalid line, just skip it
			if (*a_pData != ']') {
				continue;
			}

			// remove trailing spaces from the section
			pTrail = a_pData - 1;
			while (pTrail >= a_pSection && IsSpace(*pTrail)) {
				--pTrail;
			}
			++pTrail;
			*pTrail = 0;

			// skip to the end of the line
			++a_pData;  // safe as checked that it == ']' above
			while (*a_pData && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}

			a_pKey = NULL;
			a_pVal = NULL;
			return true;
		}

		// find the end of the key name (it may contain spaces)
		// and convert it to lowercase as necessary
		a_pKey = a_pData;
		while (*a_pData && *a_pData != '=' && !IsNewLineChar(*a_pData)) {
			++a_pData;
		}

		// if it's an invalid line, just skip it
		if (*a_pData != '=') {
			continue;
		}

		// empty keys are invalid
		if (a_pKey == a_pData) {
			while (*a_pData && !IsNewLineChar(*a_pData)) {
				++a_pData;
			}
			continue;
		}

		// remove trailing spaces from the key
		pTrail = a_pData - 1;
		while (pTrail >= a_pKey && IsSpace(*pTrail)) {
			--pTrail;
		}
		++pTrail;
		*pTrail = 0;

		// skip leading whitespace on the value
		++a_pData;  // safe as checked that it == '=' above
		while (*a_pData && !IsNewLineChar(*a_pData) && IsSpace(*a_pData)) {
			++a_pData;
		}

		// find the end of the value which is the end of this line
		a_pVal = a_pData;
		while (*a_pData && !IsNewLineChar(*a_pData)) {
			++a_pData;
		}

		// remove trailing spaces from the value
		pTrail = a_pData - 1;
		if (*a_pData) {  // prepare for the next round
			SkipNewLine(a_pData);
		}
		while (pTrail >= a_pVal && IsSpace(*pTrail)) {
			--pTrail;
		}
		++pTrail;
		*pTrail = 0;

		// check for multi-line entries
		if (m_bAllowMultiLine && IsMultiLineTag(a_pVal)) {
			// skip the "<<<" to get the tag that will end the multiline
			const SI_CHAR *pTagName = a_pVal + 3;
			return LoadMultiLineText(a_pData, a_pVal, pTagName);
		}

		// return the standard entry
		return true;
	}

	return false;
}